

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cpp
# Opt level: O2

void __thiscall VertexBuffer::set_data(VertexBuffer *this,uint32_t size,void *data,int32_t offset)

{
  (*glad_glBindBuffer)(0x8892,this->m_id);
  (*glad_glBufferSubData)(0x8892,(long)offset,(GLsizeiptr)size,data);
  return;
}

Assistant:

void VertexBuffer::set_data(uint32_t size, const void* data, int32_t offset) const
{
#if OPENGL_VERSION >= 45
    glNamedBufferSubData(m_id, offset, size, data);
#else
    bind();
    glBufferSubData(GL_ARRAY_BUFFER, offset, size, data);
#endif
}